

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::MarkFinished(cmCTestMultiProcessHandler *this)

{
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  string local_28;
  
  cmCTest::GetBinaryDir_abi_cxx11_(&local_28,this->CTest);
  std::operator+(&bStack_48,&local_28,"/Testing/Temporary/CTestCheckpoint.txt");
  std::__cxx11::string::~string((string *)&local_28);
  cmsys::SystemTools::RemoveFile(&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::MarkFinished()
{
  std::string fname = this->CTest->GetBinaryDir()
    + "/Testing/Temporary/CTestCheckpoint.txt";
  cmSystemTools::RemoveFile(fname);
}